

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O2

bool __thiscall
s2builderutil::anon_unknown_0::DegeneracyFinder::CrossingParity
          (DegeneracyFinder *this,VertexId v0,VertexId v1,bool include_same)

{
  int iVar1;
  int iVar2;
  pointer pVVar3;
  pointer piVar4;
  pointer piVar5;
  char cVar6;
  long lVar7;
  Edge *edge;
  pointer ppVar8;
  byte bVar9;
  long lVar10;
  S2Point p0;
  S2Point p0_ref;
  S2Point p1;
  S2Point local_78;
  S2Point local_60;
  S2Point local_48;
  
  lVar10 = (long)v0;
  pVVar3 = (this->g_->vertices_->
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_78.c_[2] = pVVar3[lVar10].c_[2];
  local_78.c_[0] = pVVar3[lVar10].c_[0];
  local_78.c_[1] = pVVar3[lVar10].c_[1];
  local_48.c_[2] = pVVar3[v1].c_[2];
  local_48.c_[0] = pVVar3[v1].c_[0];
  local_48.c_[1] = pVVar3[v1].c_[1];
  S2::Ortho(&local_60,&local_78);
  piVar4 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)piVar4[lVar10];
  ppVar8 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start + lVar7;
  bVar9 = 0;
  for (lVar7 = (long)piVar4[lVar10 + 1] * 8 + lVar7 * -8; lVar7 != 0; lVar7 = lVar7 + -8) {
    cVar6 = include_same;
    if (ppVar8->second != v1) {
      cVar6 = s2pred::OrderedCCW(&local_60,
                                 (this->g_->vertices_->
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + ppVar8->second,
                                 &local_48,&local_78);
    }
    bVar9 = bVar9 + cVar6;
    ppVar8 = ppVar8 + 1;
  }
  piVar4 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar5[lVar10 + 1];
  for (lVar7 = (long)piVar5[lVar10] << 2; (long)iVar1 * 4 != lVar7; lVar7 = lVar7 + 4) {
    iVar2 = (this->g_->edges_->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_start[*(int *)((long)piVar4 + lVar7)].first;
    cVar6 = include_same;
    if (iVar2 != v1) {
      cVar6 = s2pred::OrderedCCW(&local_60,
                                 (this->g_->vertices_->
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + iVar2,&local_48,
                                 &local_78);
    }
    bVar9 = bVar9 + cVar6;
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool DegeneracyFinder::CrossingParity(VertexId v0, VertexId v1,
                                      bool include_same) const {
  int crossings = 0;
  S2Point p0 = g_.vertex(v0);
  S2Point p1 = g_.vertex(v1);
  S2Point p0_ref = S2::Ortho(p0);
  for (const Edge& edge : out_.edges(v0)) {
    if (edge.second == v1) {
      if (include_same) ++crossings;
    } else if (s2pred::OrderedCCW(p0_ref, g_.vertex(edge.second), p1, p0)) {
      ++crossings;
    }
  }
  for (EdgeId e : in_.edge_ids(v0)) {
    Edge edge = g_.edge(e);
    if (edge.first == v1) {
      if (include_same) ++crossings;
    } else if (s2pred::OrderedCCW(p0_ref, g_.vertex(edge.first), p1, p0)) {
      ++crossings;
    }
  }
  return crossings & 1;
}